

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3VtabMakeWritable(Parse *pParse,Table *pTab)

{
  int iVar1;
  int iVar2;
  long lVar3;
  Table **ppTVar4;
  Parse *pPVar5;
  
  pPVar5 = pParse->pToplevel;
  if (pParse->pToplevel == (Parse *)0x0) {
    pPVar5 = pParse;
  }
  iVar1 = pPVar5->nVtabLock;
  ppTVar4 = pPVar5->apVtabLock;
  if (0 < (long)iVar1) {
    lVar3 = 0;
    do {
      if (ppTVar4[lVar3] == pTab) {
        return;
      }
      lVar3 = lVar3 + 1;
    } while (iVar1 != lVar3);
  }
  iVar2 = sqlite3_initialize();
  if ((iVar2 == 0) &&
     (ppTVar4 = (Table **)sqlite3Realloc(ppTVar4,(long)(iVar1 * 8 + 8)), ppTVar4 != (Table **)0x0))
  {
    pPVar5->apVtabLock = ppTVar4;
    iVar1 = pPVar5->nVtabLock;
    pPVar5->nVtabLock = iVar1 + 1;
    ppTVar4[iVar1] = pTab;
    return;
  }
  sqlite3OomFault(pPVar5->db);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VtabMakeWritable(Parse *pParse, Table *pTab){
  Parse *pToplevel = sqlite3ParseToplevel(pParse);
  int i, n;
  Table **apVtabLock;

  assert( IsVirtual(pTab) );
  for(i=0; i<pToplevel->nVtabLock; i++){
    if( pTab==pToplevel->apVtabLock[i] ) return;
  }
  n = (pToplevel->nVtabLock+1)*sizeof(pToplevel->apVtabLock[0]);
  apVtabLock = sqlite3_realloc64(pToplevel->apVtabLock, n);
  if( apVtabLock ){
    pToplevel->apVtabLock = apVtabLock;
    pToplevel->apVtabLock[pToplevel->nVtabLock++] = pTab;
  }else{
    sqlite3OomFault(pToplevel->db);
  }
}